

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

void __thiscall semver::version<long,_long,_long>::clear(version<long,_long,_long> *this)

{
  this->major_ = 0;
  this->minor_ = 1;
  this->patch_ = 0;
  (this->prerelease_tag_)._M_string_length = 0;
  *(this->prerelease_tag_)._M_dataplus._M_p = '\0';
  std::
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ::clear(&this->prerelease_identifiers);
  (this->build_metadata_)._M_string_length = 0;
  *(this->build_metadata_)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

SEMVER_CONSTEXPR void clear() noexcept {
      major_ = 0;
      minor_ = 1;
      patch_ = 0;

      prerelease_tag_.clear();
      prerelease_identifiers.clear();
      build_metadata_.clear();
    }